

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void AtomicHash::print(atomic<unsigned_long> *hash,ostream *os)

{
  ostream *in_RDI;
  __int_type h;
  memory_order __b;
  char *in_stack_ffffffffffffffb8;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  outputHex(in_RDI,in_stack_ffffffffffffffb8,0);
  return;
}

Assistant:

static void print(std::atomic<uint64_t>& hash, std::ostream& os) {
		auto h = hash.load();
		outputHex(std::cout, (char*)&h, sizeof(h));
	}